

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O1

string * __thiscall
embree::stringOfISA_abi_cxx11_(string *__return_storage_ptr__,embree *this,int sse2)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 < 0x200007f) {
    if (iVar2 < 0x2000007) {
      if (iVar2 == 0x2000001) {
        pcVar3 = "SSE";
        pcVar1 = "";
        goto LAB_001d711d;
      }
      if (iVar2 == 0x2000003) {
        pcVar3 = "SSE2";
        pcVar1 = "";
        goto LAB_001d711d;
      }
    }
    else {
      if (iVar2 == 0x2000007) {
        pcVar3 = "SSE3";
        pcVar1 = "";
        goto LAB_001d711d;
      }
      if (iVar2 == 0x200000f) {
        pcVar3 = "SSSE3";
        pcVar1 = "";
        goto LAB_001d711d;
      }
      if (iVar2 == 0x200001f) {
        pcVar3 = "SSE4.1";
        pcVar1 = "";
        goto LAB_001d711d;
      }
    }
  }
  else if (iVar2 < 0xe737dff) {
    if (iVar2 == 0x200007f) {
      pcVar3 = "SSE4.2";
      pcVar1 = "";
      goto LAB_001d711d;
    }
    if (iVar2 == 0x60000ff) {
      pcVar3 = "AVX";
      pcVar1 = "";
      goto LAB_001d711d;
    }
    if (iVar2 == 0x6007dff) {
      pcVar3 = "AVX2";
      pcVar1 = "";
      goto LAB_001d711d;
    }
  }
  else {
    if (iVar2 == 0xe737dff) {
      pcVar3 = "AVX512";
      pcVar1 = "";
      goto LAB_001d711d;
    }
    if (iVar2 == 0x10000003) {
      pcVar3 = "NEON";
      pcVar1 = "";
      goto LAB_001d711d;
    }
    if (iVar2 == 0x26007dff) {
      pcVar3 = "2xNEON";
      pcVar1 = "";
      goto LAB_001d711d;
    }
  }
  pcVar3 = "UNKNOWN";
  pcVar1 = "";
LAB_001d711d:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfISA (int isa)
  {
    if (isa == SSE) return "SSE";
    if (isa == SSE2) return "SSE2";
    if (isa == SSE3) return "SSE3";
    if (isa == SSSE3) return "SSSE3";
    if (isa == SSE41) return "SSE4.1";
    if (isa == SSE42) return "SSE4.2";
    if (isa == AVX) return "AVX";
    if (isa == AVX2) return "AVX2";
    if (isa == AVX512) return "AVX512";

    if (isa == NEON) return "NEON";
    if (isa == NEON_2X) return "2xNEON";
    return "UNKNOWN";
  }